

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BCRec.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,BCRec *b)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  int i;
  int local_14;
  
  std::operator<<(in_RDI,"(BCREC ");
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*(int *)(in_RSI + (long)local_14 * 4));
    poVar1 = std::operator<<(poVar1,':');
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(in_RSI + (long)(local_14 + 3) * 4))
    ;
    std::operator<<(poVar1,' ');
  }
  std::operator<<(in_RDI,')');
  return in_RDI;
}

Assistant:

std::ostream&
operator<< (std::ostream& os,
            const BCRec&  b)
{
    os << "(BCREC ";
    for (int i = 0; i < AMREX_SPACEDIM; i++)
    {
        os << b.bc[i] << ':' << b.bc[i+AMREX_SPACEDIM] << ' ';
    }
    os << ')';
    return os;
}